

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcCexTools.c
# Opt level: O0

int Bmc_CexVerify(Gia_Man_t *p,Abc_Cex_t *pCex,Abc_Cex_t *pCexCare)

{
  int iVar1;
  Gia_Obj_t *pGVar2;
  bool bVar3;
  int local_30;
  int local_2c;
  int k;
  int i;
  Gia_Obj_t *pObj;
  Abc_Cex_t *pCexCare_local;
  Abc_Cex_t *pCex_local;
  Gia_Man_t *p_local;
  
  pGVar2 = Gia_ManConst0(p);
  Gia_ObjTerSimSet0(pGVar2);
  local_30 = 0;
  while( true ) {
    iVar1 = Gia_ManRegNum(p);
    bVar3 = false;
    if (local_30 < iVar1) {
      iVar1 = Gia_ManPoNum(p);
      _k = Gia_ManCo(p,iVar1 + local_30);
      bVar3 = _k != (Gia_Obj_t *)0x0;
    }
    if (!bVar3) break;
    Gia_ObjTerSimSet0(_k);
    local_30 = local_30 + 1;
  }
  for (local_2c = 0; local_2c <= pCex->iFrame; local_2c = local_2c + 1) {
    local_30 = 0;
    while( true ) {
      iVar1 = Gia_ManPiNum(p);
      bVar3 = false;
      if (local_30 < iVar1) {
        _k = Gia_ManCi(p,local_30);
        bVar3 = _k != (Gia_Obj_t *)0x0;
      }
      if (!bVar3) break;
      iVar1 = Abc_InfoHasBit((uint *)(pCexCare + 1),
                             pCexCare->nRegs + local_2c * pCexCare->nPis + local_30);
      if (iVar1 == 0) {
        Gia_ObjTerSimSetX(_k);
      }
      else {
        iVar1 = Abc_InfoHasBit((uint *)(pCex + 1),pCex->nRegs + local_2c * pCex->nPis + local_30);
        if (iVar1 == 0) {
          Gia_ObjTerSimSet0(_k);
        }
        else {
          Gia_ObjTerSimSet1(_k);
        }
      }
      local_30 = local_30 + 1;
    }
    local_30 = 0;
    while( true ) {
      iVar1 = Gia_ManRegNum(p);
      bVar3 = false;
      if (local_30 < iVar1) {
        iVar1 = Gia_ManPiNum(p);
        _k = Gia_ManCi(p,iVar1 + local_30);
        bVar3 = _k != (Gia_Obj_t *)0x0;
      }
      if (!bVar3) break;
      Gia_ObjTerSimRo(p,_k);
      local_30 = local_30 + 1;
    }
    local_30 = 0;
    while( true ) {
      bVar3 = false;
      if (local_30 < p->nObjs) {
        _k = Gia_ManObj(p,local_30);
        bVar3 = _k != (Gia_Obj_t *)0x0;
      }
      if (!bVar3) break;
      iVar1 = Gia_ObjIsAnd(_k);
      if (iVar1 != 0) {
        Gia_ObjTerSimAnd(_k);
      }
      local_30 = local_30 + 1;
    }
    local_30 = 0;
    while( true ) {
      iVar1 = Vec_IntSize(p->vCos);
      bVar3 = false;
      if (local_30 < iVar1) {
        _k = Gia_ManCo(p,local_30);
        bVar3 = _k != (Gia_Obj_t *)0x0;
      }
      if (!bVar3) break;
      Gia_ObjTerSimCo(_k);
      local_30 = local_30 + 1;
    }
  }
  pGVar2 = Gia_ManPo(p,pCex->iPo);
  iVar1 = Gia_ObjTerSimGet1(pGVar2);
  return iVar1;
}

Assistant:

int Bmc_CexVerify( Gia_Man_t * p, Abc_Cex_t * pCex, Abc_Cex_t * pCexCare )
{
    Gia_Obj_t * pObj;
    int i, k;
//    assert( pCex->nRegs > 0 );
//    assert( pCexCare->nRegs == 0 );
    Gia_ObjTerSimSet0( Gia_ManConst0(p) );
    Gia_ManForEachRi( p, pObj, k )
        Gia_ObjTerSimSet0( pObj );
    for ( i = 0; i <= pCex->iFrame; i++ )
    {
        Gia_ManForEachPi( p, pObj, k )
        {
            if ( !Abc_InfoHasBit( pCexCare->pData, pCexCare->nRegs + i * pCexCare->nPis + k ) )
                Gia_ObjTerSimSetX( pObj );
            else if ( Abc_InfoHasBit( pCex->pData, pCex->nRegs + i * pCex->nPis + k ) )
                Gia_ObjTerSimSet1( pObj );
            else
                Gia_ObjTerSimSet0( pObj );
        }
        Gia_ManForEachRo( p, pObj, k )
            Gia_ObjTerSimRo( p, pObj );
        Gia_ManForEachAnd( p, pObj, k )
            Gia_ObjTerSimAnd( pObj );
        Gia_ManForEachCo( p, pObj, k )
            Gia_ObjTerSimCo( pObj );
    }
    pObj = Gia_ManPo( p, pCex->iPo );
    return Gia_ObjTerSimGet1(pObj);
}